

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O2

aiReturn __thiscall
aiMaterial::AddProperty(aiMaterial *this,aiString *pInput,char *pKey,uint type,uint index)

{
  aiReturn aVar1;
  
  aVar1 = AddBinaryProperty(this,pInput,pInput->length + 5,pKey,type,index,aiPTI_String);
  return aVar1;
}

Assistant:

aiReturn aiMaterial::AddProperty (const aiString* pInput,
    const char* pKey,
    unsigned int type,
    unsigned int index)
{
    ai_assert(sizeof(ai_uint32)==4);
    return AddBinaryProperty(pInput,
        static_cast<unsigned int>(pInput->length+1+4),
        pKey,
        type,
        index,
        aiPTI_String);
}